

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCall0(ExpressionContext *ctx,SynBase *source,InplaceStr name,bool allowFailure,
                   bool allowInternal,bool allowFastLookup)

{
  InplaceStr name_00;
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  undefined1 local_a8 [12];
  char *local_98;
  char *pcStack_90;
  undefined1 local_80 [8];
  SmallArray<ArgumentData,_1U> arguments;
  bool allowFastLookup_local;
  bool allowInternal_local;
  bool allowFailure_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  arguments.allocator._5_1_ = allowFastLookup;
  arguments.allocator._6_1_ = allowInternal;
  arguments.allocator._7_1_ = allowFailure;
  SmallArray<ArgumentData,_1U>::SmallArray((SmallArray<ArgumentData,_1U> *)local_80,ctx->allocator);
  local_98 = name.begin;
  pcStack_90 = name.end;
  ArrayView<ArgumentData>::ArrayView<1u>
            ((ArrayView<ArgumentData> *)local_a8,(SmallArray<ArgumentData,_1U> *)local_80);
  name_00.end = pcStack_90;
  name_00.begin = local_98;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)local_a8._0_8_;
  arguments_00.count = local_a8._8_4_;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name_00,arguments_00,(bool)(arguments.allocator._7_1_ & 1),
                      (bool)(arguments.allocator._6_1_ & 1),(bool)(arguments.allocator._5_1_ & 1));
  SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_80);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall0(ExpressionContext &ctx, SynBase *source, InplaceStr name, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}